

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

mpack_node_data_t * mpack_node_map_uint_impl(mpack_node_t node,uint64_t num)

{
  int iVar1;
  mpack_node_data_t *pmVar2;
  uint64_t uVar3;
  mpack_error_t error;
  mpack_node_data_t *pmVar4;
  mpack_node_data_t *pmVar5;
  long lVar6;
  
  pmVar5 = node.data;
  if ((node.tree)->error != mpack_ok) {
    return (mpack_node_data_t *)0x0;
  }
  if (pmVar5->type == mpack_type_map) {
    pmVar4 = (mpack_node_data_t *)0x0;
    for (lVar6 = 0; (ulong)pmVar5->len << 5 != lVar6; lVar6 = lVar6 + 0x20) {
      pmVar2 = (pmVar5->value).children;
      iVar1 = *(int *)((long)&pmVar2->type + lVar6);
      if (iVar1 == 3) {
        uVar3 = *(uint64_t *)((long)&pmVar2->value + lVar6);
        if (uVar3 == num && -1 < (long)uVar3) goto LAB_001081f3;
      }
      else if ((iVar1 == 4) && (*(uint64_t *)((long)&pmVar2->value + lVar6) == num)) {
LAB_001081f3:
        if (pmVar4 != (mpack_node_data_t *)0x0) {
          error = mpack_error_data;
          goto LAB_00108208;
        }
        pmVar4 = (mpack_node_data_t *)((long)&pmVar2[1].type + lVar6);
      }
    }
  }
  else {
    error = mpack_error_type;
LAB_00108208:
    mpack_tree_flag_error(node.tree,error);
    pmVar4 = (mpack_node_data_t *)0x0;
  }
  return pmVar4;
}

Assistant:

static mpack_node_data_t* mpack_node_map_uint_impl(mpack_node_t node, uint64_t num) {
    if (mpack_node_error(node) != mpack_ok)
        return NULL;

    if (node.data->type != mpack_type_map) {
        mpack_node_flag_error(node, mpack_error_type);
        return NULL;
    }

    mpack_node_data_t* found = NULL;

    for (size_t i = 0; i < node.data->len; ++i) {
        mpack_node_data_t* key = mpack_node_child(node, i * 2);

        if ((key->type == mpack_type_uint && key->value.u == num) ||
            (key->type == mpack_type_int && key->value.i >= 0 && (uint64_t)key->value.i == num))
        {
            if (found) {
                mpack_node_flag_error(node, mpack_error_data);
                return NULL;
            }
            found = mpack_node_child(node, i * 2 + 1);
        }
    }

    if (found)
        return found;

    return NULL;
}